

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

Orphan<capnp::DynamicCapability> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::DynamicCapability::Client>
          (Orphan<capnp::DynamicCapability> *__return_storage_ptr__,Orphanage *this,Client *copyFrom
          )

{
  BuilderArena *src;
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> local_58;
  OrphanBuilder local_48;
  Schema local_28;
  Client *local_20;
  Client *copyFrom_local;
  Orphanage *this_local;
  
  local_20 = copyFrom;
  copyFrom_local = (Client *)this;
  this_local = (Orphanage *)__return_storage_ptr__;
  local_28.raw = (RawBrandedSchema *)DynamicCapability::Client::getSchema(copyFrom);
  src = this->arena;
  pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)copyFrom);
  (*pCVar1->_vptr_ClientHook[4])();
  capnp::_::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)src);
  Orphan<capnp::DynamicCapability>::Orphan
            (__return_storage_ptr__,(InterfaceSchema)local_28.raw,&local_48);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_48);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<DynamicCapability> Orphanage::newOrphanCopy<DynamicCapability::Client>(
    DynamicCapability::Client copyFrom) const {
  return Orphan<DynamicCapability>(
      copyFrom.getSchema(), _::OrphanBuilder::copy(arena, capTable, copyFrom.hook->addRef()));
}